

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O2

char * blob_read_string(blob_reader *blob)

{
  uint8_t *puVar1;
  _Bool _Var2;
  void *pvVar3;
  size_t size;
  
  puVar1 = blob->current;
  if ((puVar1 < blob->end) &&
     (pvVar3 = memchr(puVar1,0,(long)blob->end - (long)puVar1), pvVar3 != (void *)0x0)) {
    size = (size_t)(((int)pvVar3 - (int)puVar1) + 1);
    _Var2 = ensure_can_read(blob,size);
    if (_Var2) {
      puVar1 = blob->current;
      blob->current = puVar1 + size;
      return (char *)puVar1;
    }
    __assert_fail("ensure_can_read(blob, size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/blob.c"
                  ,0x169,"char *blob_read_string(struct blob_reader *)");
  }
  blob->overrun = true;
  return (char *)0x0;
}

Assistant:

char *
blob_read_string(struct blob_reader *blob)
{
   int size;
   char *ret;
   uint8_t *nul;

   /* If we're already at the end, then this is an overrun. */
   if (blob->current >= blob->end) {
      blob->overrun = true;
      return NULL;
   }

   /* Similarly, if there is no zero byte in the data remaining in this blob,
    * we also consider that an overrun.
    */
   nul = memchr(blob->current, 0, blob->end - blob->current);

   if (nul == NULL) {
      blob->overrun = true;
      return NULL;
   }

   size = nul - blob->current + 1;

   assert(ensure_can_read(blob, size));

   ret = (char *) blob->current;

   blob->current += size;

   return ret;
}